

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O0

void __thiscall
diy::detail::ReductionFunctor<Block<float>,_diy::RegularSwapPartners>::operator()
          (ReductionFunctor<Block<float>,_diy::RegularSwapPartners> *this,Block<float> *b,
          ProxyWithLink *cp)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Master *pMVar5;
  size_t sVar6;
  size_type sVar7;
  Link *this_00;
  Proxy *in_RDX;
  int *in_RDI;
  BlockID target;
  const_iterator __end4;
  const_iterator __begin4;
  Neighbors *__range4;
  OutgoingQueues *outgoing;
  ReduceProxy rp;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  Master *in_stack_fffffffffffffe08;
  RegularSwapPartners *__args_2;
  ReduceProxy *in_stack_fffffffffffffe10;
  Block<float> *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Master *in_stack_fffffffffffffe50;
  GIDVector *in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  undefined8 in_stack_fffffffffffffe78;
  uint round;
  Proxy *proxy;
  GIDVector *in_stack_fffffffffffffea0;
  __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
  local_158;
  ReduceProxy *local_150;
  OutgoingQueues *local_148;
  ReduceProxy local_140;
  undefined1 local_48 [72];
  
  round = (uint)((ulong)in_stack_fffffffffffffe78 >> 0x20);
  proxy = (Proxy *)(in_RDI + 10);
  iVar4 = *in_RDI;
  local_48._48_8_ = in_RDX;
  iVar3 = Master::Proxy::gid(in_RDX);
  pMVar5 = Master::Proxy::master((Proxy *)local_48._48_8_);
  bVar2 = RegularSwapPartners::active((RegularSwapPartners *)proxy,iVar4,iVar3,pMVar5);
  if (bVar2) {
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a3f99);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1a3fa6);
    if (0 < *in_RDI) {
      in_stack_fffffffffffffe68 = (GIDVector *)(in_RDI + 10);
      in_stack_fffffffffffffe70 = *in_RDI;
      in_stack_fffffffffffffe74 = Master::Proxy::gid((Proxy *)local_48._48_8_);
      pMVar5 = Master::Proxy::master((Proxy *)local_48._48_8_);
      round = (uint)((ulong)pMVar5 >> 0x20);
      RegularSwapPartners::incoming
                ((RegularSwapPartners *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
    }
    iVar1 = *in_RDI;
    sVar6 = RegularPartners::rounds((RegularPartners *)0x1a403c);
    if (iVar1 < (int)sVar6) {
      in_stack_fffffffffffffe48 = *in_RDI;
      in_stack_fffffffffffffe4c = Master::Proxy::gid((Proxy *)local_48._48_8_);
      in_stack_fffffffffffffe50 = Master::Proxy::master((Proxy *)local_48._48_8_);
      RegularSwapPartners::outgoing
                ((RegularSwapPartners *)
                 CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 (int)((ulong)in_stack_fffffffffffffe18 >> 0x20),(int)in_stack_fffffffffffffe18,
                 (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffe10,
                 in_stack_fffffffffffffe08);
    }
    __args_2 = (RegularSwapPartners *)local_48;
    ReduceProxy::ReduceProxy
              ((ReduceProxy *)CONCAT44(iVar3,iVar4),proxy,in_RDI,round,
               (Assigner *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
               in_stack_fffffffffffffe68,in_stack_fffffffffffffea0);
    std::function<void_(Block<float>_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
    ::operator()((function<void_(Block<float>_*,_const_diy::ReduceProxy_&,_const_diy::RegularSwapPartners_&)>
                  *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                 in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,__args_2);
    local_148 = Master::Proxy::outgoing(&local_140.super_Proxy);
    sVar7 = std::
            map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
            ::size((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                    *)0x1a4144);
    ReduceProxy::out_link(&local_140);
    iVar4 = Link::size((Link *)0x1a4167);
    if (sVar7 < (ulong)(long)iVar4) {
      this_00 = ReduceProxy::out_link(&local_140);
      in_stack_fffffffffffffe10 = (ReduceProxy *)Link::neighbors(this_00);
      local_150 = in_stack_fffffffffffffe10;
      local_158._M_current =
           (BlockID *)
           std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::begin
                     ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::end
                ((vector<diy::BlockID,_std::allocator<diy::BlockID>_> *)__args_2);
      while (bVar2 = __gnu_cxx::operator!=
                               ((__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)in_stack_fffffffffffffe10,
                                (__normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
                                 *)__args_2), bVar2) {
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator*(&local_158);
        std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[]((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)in_stack_fffffffffffffe50,
                     (key_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
        __gnu_cxx::
        __normal_iterator<const_diy::BlockID_*,_std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>_>
        ::operator++(&local_158);
      }
    }
    ReduceProxy::~ReduceProxy(in_stack_fffffffffffffe10);
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar4,in_stack_fffffffffffffe20));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)CONCAT44(iVar4,in_stack_fffffffffffffe20));
  }
  return;
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }